

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall QDockAreaLayout::updateSeparatorWidgets(QDockAreaLayout *this)

{
  bool bVar1;
  long lVar2;
  qsizetype qVar3;
  const_reference ppQVar4;
  reference ppQVar5;
  QWidget *pQVar6;
  QList<QWidget_*> *this_00;
  QDockAreaLayout *in_RDI;
  long in_FS_OFFSET;
  int i_1;
  QWidget *sepWidget;
  QDockAreaLayoutInfo *dock;
  int i;
  int j;
  QRect sepRect;
  parameter_type in_stack_ffffffffffffff28;
  QPoint *in_stack_ffffffffffffff30;
  QWidget *in_stack_ffffffffffffff38;
  QWidget *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  QWidget *this_01;
  int local_90;
  int index;
  QDockAreaLayout *this_02;
  QRect local_60;
  QRegion local_50;
  QRect local_48;
  undefined1 local_38 [16];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  index = 0;
  this_02 = in_RDI;
  for (local_90 = 0; local_90 < 4; local_90 = local_90 + 1) {
    this_01 = (QWidget *)(in_RDI->docks + local_90);
    bVar1 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x57bee9);
    if (!bVar1) {
      lVar2 = (long)index;
      qVar3 = QList<QWidget_*>::size(&in_RDI->separatorWidgets);
      if (lVar2 < qVar3) {
        ppQVar4 = QList<QWidget_*>::at
                            ((QList<QWidget_*> *)in_stack_ffffffffffffff30,
                             (qsizetype)in_stack_ffffffffffffff28);
        pQVar6 = *ppQVar4;
        if (*ppQVar4 == (QWidget *)0x0) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,
                     (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                     (char *)in_stack_ffffffffffffff28);
          QMessageLogger::warning
                    (local_28,"QDockAreaLayout::updateSeparatorWidgets: null separator widget");
          qt_mainwindow_layout((QMainWindow *)0x57bf8f);
          in_stack_ffffffffffffff40 =
               QMainWindowLayout::getSeparatorWidget
                         ((QMainWindowLayout *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          pQVar6 = in_stack_ffffffffffffff40;
          ppQVar5 = QList<QWidget_*>::operator[]
                              ((QList<QWidget_*> *)in_stack_ffffffffffffff30,
                               (qsizetype)in_stack_ffffffffffffff28);
          *ppQVar5 = in_stack_ffffffffffffff40;
        }
      }
      else {
        qt_mainwindow_layout((QMainWindow *)0x57bfd4);
        pQVar6 = QMainWindowLayout::getSeparatorWidget
                           ((QMainWindowLayout *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        QList<QWidget_*>::append((QList<QWidget_*> *)0x57bff7,in_stack_ffffffffffffff28);
      }
      in_stack_ffffffffffffff38 = pQVar6;
      index = index + 1;
      raiseSeparatorWidget((QWidget *)in_RDI);
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = separatorRect(this_02,index);
      local_38 = (undefined1  [16])
                 QRect::adjusted((QRect *)this_01,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                                 (int)in_stack_ffffffffffffff38,in_stack_ffffffffffffff5c,
                                 in_stack_ffffffffffffff58);
      QWidget::setGeometry(this_01,(QRect *)in_stack_ffffffffffffff38);
      pQVar6 = in_stack_ffffffffffffff38;
      separatorRect(this_02,index);
      QRect::topLeft((QRect *)in_stack_ffffffffffffff28);
      ::operator-(in_stack_ffffffffffffff30);
      local_60 = QRect::translated((QRect *)this_01,(QPoint *)pQVar6);
      QRegion::QRegion(&local_50,(QRect *)&local_60,Rectangle);
      QWidget::setMask(pQVar6,(QRegion *)
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QRegion::~QRegion(&local_50);
      QWidget::show(in_stack_ffffffffffffff40);
    }
  }
  while( true ) {
    this_00 = (QList<QWidget_*> *)(long)index;
    qVar3 = QList<QWidget_*>::size(&in_RDI->separatorWidgets);
    if (qVar3 <= (long)this_00) break;
    QList<QWidget_*>::at(this_00,(qsizetype)in_stack_ffffffffffffff28);
    QWidget::hide((QWidget *)0x57c181);
    index = index + 1;
  }
  QList<QWidget_*>::resize
            ((QList<QWidget_*> *)in_stack_ffffffffffffff40,(qsizetype)in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockAreaLayout::updateSeparatorWidgets() const
{
    int j = 0;

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &dock = docks[i];
        if (dock.isEmpty())
            continue;

        QWidget *sepWidget;
        if (j < separatorWidgets.size()) {
            sepWidget = separatorWidgets.at(j);
            if (!sepWidget) {
                qWarning("QDockAreaLayout::updateSeparatorWidgets: null separator widget");
                sepWidget = qt_mainwindow_layout(mainWindow)->getSeparatorWidget();
                separatorWidgets[j] = sepWidget;
            }
        } else {
            sepWidget = qt_mainwindow_layout(mainWindow)->getSeparatorWidget();
            separatorWidgets.append(sepWidget);
        }
        j++;

        Q_ASSERT(sepWidget);
        raiseSeparatorWidget(sepWidget);

        QRect sepRect = separatorRect(i).adjusted(-2, -2, 2, 2);
        sepWidget->setGeometry(sepRect);
        sepWidget->setMask( QRegion(separatorRect(i).translated( - sepRect.topLeft())));
        sepWidget->show();
    }
    for (int i = j; i < separatorWidgets.size(); ++i)
        separatorWidgets.at(i)->hide();

    separatorWidgets.resize(j);
}